

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

TimingControl * __thiscall slang::ast::CovergroupType::getCoverageEvent(CovergroupType *this)

{
  SyntaxKind SVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  TimingControl *pTVar6;
  undefined4 extraout_var;
  LookupLocation LVar7;
  ASTContext local_48;
  
  if ((this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
    return (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
           _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
           _M_value;
  }
  pTVar6 = (TimingControl *)(this->super_Type).super_Symbol.originatingSyntax;
  if (pTVar6 == (TimingControl *)0x0 || (this->super_Type).super_Symbol.parentScope == (Scope *)0x0)
  goto LAB_001f8110;
  pSVar2 = pTVar6[4].syntax;
  if (pSVar2 == (SyntaxNode *)0x0) {
LAB_001f80dd:
    bVar4 = true;
  }
  else {
    sVar3 = (this->arguments)._M_extent._M_extent_value;
    if (sVar3 == 0) {
      local_48.lookupIndex = 0;
    }
    else {
      LVar7 = LookupLocation::after((Symbol *)(this->arguments)._M_ptr[sVar3 - 1]);
      local_48.lookupIndex = LVar7.index;
    }
    local_48.scope.ptr = &this->super_Scope;
    local_48.flags.m_bits = 0;
    local_48.instanceOrProc = (Symbol *)0x0;
    local_48.firstTempVar = (TempVarSymbol *)0x0;
    local_48.randomizeDetails = (RandomizeDetails *)0x0;
    local_48.assertionInstance = (AssertionInstanceDetails *)0x0;
    SVar1 = pSVar2->kind;
    pTVar6 = (TimingControl *)(ulong)SVar1;
    if (SVar1 == EventControlWithExpression) {
      iVar5 = TimingControl::bind((int)pSVar2,(sockaddr *)&local_48,local_48.lookupIndex);
      pTVar6 = (TimingControl *)CONCAT44(extraout_var,iVar5);
    }
    else {
      if (SVar1 != BlockCoverageEvent) goto LAB_001f80dd;
      pTVar6 = BlockEventListControl::fromSyntax
                         ((BlockEventExpressionSyntax *)pSVar2[2].parent,&local_48);
    }
    (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value = pTVar6;
    if ((this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == false) {
      (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
    }
    pTVar6 = (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
             _M_value;
    bVar4 = false;
  }
  if (!bVar4) {
    return pTVar6;
  }
LAB_001f8110:
  (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
       (TimingControl *)0x0;
  if ((this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == false) {
    (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
  }
  return (TimingControl *)0x0;
}

Assistant:

const TimingControl* CovergroupType::getCoverageEvent() const {
    if (event)
        return *event;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (scope && syntax) {
        if (auto evSyntax = syntax->as<CovergroupDeclarationSyntax>().event) {
            LookupLocation ll = LookupLocation::min;
            if (!arguments.empty())
                ll = LookupLocation::after(*arguments.back());

            ASTContext context(*this, ll);

            if (evSyntax->kind == SyntaxKind::BlockCoverageEvent) {
                event = &BlockEventListControl::fromSyntax(
                    *evSyntax->as<BlockCoverageEventSyntax>().expr, context);
                return *event;
            }
            else if (evSyntax->kind == SyntaxKind::EventControlWithExpression) {
                event = &TimingControl::bind(evSyntax->as<EventControlWithExpressionSyntax>(),
                                             context);
                return *event;
            }
        }
    }

    event = nullptr;
    return nullptr;
}